

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFunctionDecPOMDPDiscrete.cpp
# Opt level: O2

double __thiscall
ValueFunctionDecPOMDPDiscrete::GetCached
          (ValueFunctionDecPOMDPDiscrete *this,Index sI,Index JOHI,bool *valid)

{
  iterator iVar1;
  double dVar2;
  key_type local_c;
  
  local_c = sI * (int)this->_m_nrJOH + JOHI;
  iVar1 = boost::unordered::detail::
          table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
          ::find_node((table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                       *)&this->_m_cache,&local_c);
  *valid = iVar1.node_ != (node_pointer)0x0;
  if (iVar1.node_ == (node_pointer)0x0) {
    dVar2 = 0.0;
  }
  else {
    dVar2 = *(double *)
             ((long)&((iVar1.node_)->super_value_base<std::pair<const_unsigned_int,_double>_>).data_
                     .data_ + 8);
  }
  return dVar2;
}

Assistant:

double ValueFunctionDecPOMDPDiscrete::GetCached(Index sI, Index JOHI,bool &valid)
{
    CacheType::const_iterator it=_m_cache.find(GetCombinedIndex(sI, JOHI));
    valid=(it!=_m_cache.end());
    if (valid)
        return it->second;
    else
        return 0;
}